

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O2

void av1_get_one_pass_rt_params
               (AV1_COMP *cpi,FRAME_TYPE *frame_type,EncodeFrameInput *frame_input,uint frame_flags)

{
  FRAME_TYPE frame_type_00;
  aom_tune_content aVar1;
  RESIZE_STATE RVar2;
  aom_rc_mode aVar3;
  AV1_PRIMARY *pAVar4;
  LAYER_CONTEXT *pLVar5;
  YV12_BUFFER_CONFIG *pYVar6;
  YV12_BUFFER_CONFIG *pYVar7;
  SequenceHeader *pSVar8;
  uchar *puVar9;
  uint64_t uVar10;
  int iVar11;
  FrameDimensionCfg *pFVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  AV1_PRIMARY *pAVar19;
  uint64_t *puVar20;
  ulong uVar21;
  int16_t *ref;
  int16_t *ref_00;
  int16_t *src;
  int16_t *src_00;
  _Bool _Var22;
  sbyte sVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  int *piVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  int sbi_col;
  ulong uVar33;
  int iVar34;
  int *piVar35;
  long lVar36;
  int iVar37;
  ulong uVar38;
  int iVar39;
  uint8_t *puVar40;
  int iVar41;
  uint uVar42;
  ulong uVar43;
  long lVar44;
  uint8_t *puVar45;
  bool bVar46;
  double dVar47;
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [16];
  double dVar51;
  int local_f8;
  uint local_e8;
  ulong local_d8;
  uint local_68;
  int best_sad_col;
  long local_60;
  EncodeFrameInput *local_58;
  long local_50;
  YV12_BUFFER_CONFIG *local_48;
  ulong local_40;
  uint local_34;
  
  pAVar4 = cpi->ppi;
  iVar13 = (cpi->svc).spatial_layer_id;
  iVar15 = (cpi->svc).number_temporal_layers;
  iVar34 = (cpi->svc).temporal_layer_id;
  iVar37 = (cpi->oxcf).rc_cfg.max_consec_drop_ms;
  local_58 = frame_input;
  if (0 < iVar37) {
    dVar51 = cpi->framerate;
    dVar47 = round(dVar51);
    dVar47 = ceil(((double)((ulong)dVar47 & -(ulong)(1.0 < dVar51) |
                           ~-(ulong)(1.0 < dVar51) & (ulong)dVar51) * (double)iVar37) / 1000.0);
    dVar51 = 2147483647.0;
    if (dVar47 <= 2147483647.0) {
      dVar51 = dVar47;
    }
    (cpi->rc).max_consec_drop = (int)dVar51;
  }
  lVar44 = (long)iVar15 * (long)iVar13 + (long)iVar34;
  pAVar19 = pAVar4;
  if (pAVar4->use_svc != 0) {
    av1_update_temporal_layer_framerate(cpi);
    av1_restore_layer_context(cpi);
    pAVar19 = cpi->ppi;
  }
  if (((((pAVar19->rtc_ref).set_ref_frame_config == 0) || ((cpi->svc).number_temporal_layers != 1))
      || ((cpi->svc).number_spatial_layers != 1)) ||
     ((pAVar19->rtc_ref).reference_was_previous_frame != true)) {
LAB_001e8683:
    _Var22 = false;
  }
  else {
    iVar13 = av1_svc_get_min_ref_dist(cpi);
    _Var22 = true;
    if (iVar13 + 0x80000001U < 0x80000006) goto LAB_001e8683;
  }
  pAVar19 = cpi->ppi;
  (pAVar19->rtc_ref).bias_recovery_frame = _Var22;
  local_50 = (long)(int)lVar44;
  if (((frame_flags & 1) == 0) && ((cpi->common).current_frame.frame_number != 0)) {
    if (pAVar19->use_svc == 0) {
      if ((cpi->oxcf).kf_cfg.auto_key == true) {
        uVar29 = (cpi->rc).frames_to_key;
joined_r0x001e8703:
        if (uVar29 == 0) goto LAB_001e877a;
      }
    }
    else if (((cpi->svc).spatial_layer_id == 0) && ((cpi->oxcf).kf_cfg.auto_key == true)) {
      uVar29 = (cpi->oxcf).kf_cfg.key_freq_max;
      if (uVar29 != 0) {
        uVar29 = (cpi->svc).current_superframe % uVar29;
        goto joined_r0x001e8703;
      }
      goto LAB_001e877a;
    }
    *frame_type = '\x01';
    (pAVar4->gf_group).update_type[cpi->gf_frame_index] = '\x01';
    (pAVar4->gf_group).frame_type[cpi->gf_frame_index] = '\x01';
    (pAVar4->gf_group).refbuf_state[cpi->gf_frame_index] = '\x01';
    pAVar19 = cpi->ppi;
    if (pAVar19->use_svc != 0) {
      pLVar5 = (cpi->svc).layer_context;
      if ((cpi->svc).spatial_layer_id == 0) {
        iVar13 = 0;
      }
      else {
        iVar13 = pLVar5[(cpi->svc).temporal_layer_id].is_key_frame;
      }
      pLVar5[local_50].is_key_frame = iVar13;
    }
    if ((pAVar19->rtc_ref).set_ref_frame_config != 0) {
      lVar44 = 0;
      do {
        if (lVar44 == 7) {
          *frame_type = '\x02';
          break;
        }
        piVar28 = (pAVar19->rtc_ref).reference + lVar44;
        lVar44 = lVar44 + 1;
      } while (*piVar28 == 0);
    }
  }
  else {
LAB_001e877a:
    *frame_type = '\0';
    if ((cpi->common).current_frame.frame_number == 0) {
      uVar29 = 0;
    }
    else {
      uVar29 = (uint)((cpi->rc).frames_to_key == 0);
    }
    (pAVar4->p_rc).this_key_frame_forced = uVar29;
    (cpi->rc).frames_to_key = (cpi->oxcf).kf_cfg.key_freq_max;
    (pAVar4->p_rc).kf_boost = 0x8fc;
    (pAVar4->gf_group).update_type[cpi->gf_frame_index] = '\0';
    (pAVar4->gf_group).frame_type[cpi->gf_frame_index] = '\0';
    (pAVar4->gf_group).refbuf_state[cpi->gf_frame_index] = '\0';
    pAVar19 = cpi->ppi;
    if (pAVar19->use_svc != 0) {
      if ((cpi->common).current_frame.frame_number != 0) {
        av1_svc_reset_temporal_layers(cpi,1);
        pAVar19 = cpi->ppi;
      }
      (cpi->svc).layer_context[lVar44].is_key_frame = 1;
    }
    (cpi->rc).frame_number_encoded = 0;
    (pAVar19->rtc_ref).non_reference_frame = 0;
    (cpi->rc).static_since_last_scene_change = 0;
  }
  if (((cpi->active_map).enabled == 0) || ((cpi->rc).percent_blocks_inactive != 100)) {
    if (((cpi->sf).rt_sf.check_scene_detection != 0) && ((cpi->svc).spatial_layer_id == 0)) {
      if (((cpi->rc).prev_coded_width == (cpi->common).width) &&
         ((cpi->rc).prev_coded_height == (cpi->common).height)) {
        pYVar6 = local_58->source;
        pYVar7 = local_58->last_source;
        pFVar12 = &(cpi->oxcf).frm_dim_cfg;
        piVar28 = &(cpi->oxcf).frm_dim_cfg.height;
        if ((cpi->svc).number_spatial_layers < 2) {
          piVar28 = &(cpi->common).height;
          pFVar12 = (FrameDimensionCfg *)&(cpi->common).width;
        }
        iVar13 = pFVar12->width;
        iVar15 = *piVar28;
        if ((iVar13 != (cpi->common).render_width) ||
           ((pYVar7 == (YV12_BUFFER_CONFIG *)0x0 || pYVar6 == (YV12_BUFFER_CONFIG *)0x0) ||
            iVar15 != (cpi->common).render_height)) {
          aom_free(cpi->src_sad_blk_64x64);
          cpi->src_sad_blk_64x64 = (uint64_t *)0x0;
        }
        if (pYVar7 != (YV12_BUFFER_CONFIG *)0x0 && pYVar6 != (YV12_BUFFER_CONFIG *)0x0) {
          if (((pYVar6->field_0).field_0.y_width != (pYVar7->field_0).field_0.y_width) ||
             ((pYVar6->field_1).field_0.y_height != (pYVar7->field_1).field_0.y_height))
          goto LAB_001e8a92;
          puVar45 = (pYVar6->field_5).buffers[0];
          iVar34 = (pYVar6->field_4).field_0.y_stride;
          puVar40 = (pYVar7->field_5).buffers[0];
          iVar37 = (pYVar7->field_4).field_0.y_stride;
          (cpi->rc).high_source_sad = 0;
          (cpi->rc).percent_blocks_with_motion = 0;
          (cpi->rc).max_block_source_sad = 0;
          (cpi->rc).prev_avg_source_sad = (cpi->rc).avg_source_sad;
          piVar28 = &(cpi->svc).mi_cols_full_resoln;
          piVar35 = &(cpi->svc).mi_rows_full_resoln;
          if ((cpi->svc).number_spatial_layers < 2) {
            piVar35 = &(cpi->common).mi_params.mi_rows;
            piVar28 = &(cpi->common).mi_params.mi_cols;
          }
          aVar1 = (cpi->oxcf).tune_cfg.content;
          iVar39 = (cpi->common).width;
          iVar14 = (cpi->common).height;
          if ((cpi->sf).rt_sf.higher_thresh_scene_detection == 0) {
            local_e8 = 10000;
            if (aVar1 == AOM_CONTENT_SCREEN) {
              local_e8 = 8000;
            }
            if (iVar14 * iVar39 < 0x12c01) {
              dVar51 = cpi->framerate;
              goto LAB_001e8fdd;
            }
LAB_001e8ffd:
            local_60 = (ulong)(aVar1 != AOM_CONTENT_SCREEN) + 5;
          }
          else {
            local_e8 = 100000;
            if (0x12c00 < iVar14 * iVar39) goto LAB_001e8ffd;
            dVar51 = cpi->framerate;
            local_e8 = 100000;
            if (dVar51 < 10.0) {
              local_e8 = 50000;
            }
LAB_001e8fdd:
            if (10.0 <= dVar51) goto LAB_001e8ffd;
            local_60 = 5;
          }
          pSVar8 = (cpi->common).seq_params;
          iVar39 = pSVar8->mib_size >> (pSVar8->sb_size == BLOCK_128X128);
          uVar43 = (long)(*piVar28 + iVar39 + -1) / (long)iVar39;
          iVar39 = (*piVar35 + iVar39 + -1) / iVar39;
          if ((cpi->rc).prev_frame_is_dropped == 0) {
            iVar14 = -(uint)(1 < (cpi->svc).number_temporal_layers);
          }
          else {
            iVar14 = -1;
          }
          iVar41 = (int)uVar43;
          local_48 = pYVar7;
          if (((iVar13 == (cpi->common).render_width) && (iVar15 == (cpi->common).render_height)) &&
             (cpi->src_sad_blk_64x64 == (uint64_t *)0x0)) {
            puVar20 = (uint64_t *)aom_calloc((long)(iVar39 * iVar41),8);
            cpi->src_sad_blk_64x64 = puVar20;
            if (puVar20 == (uint64_t *)0x0) {
              aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate cpi->src_sad_blk_64x64");
            }
          }
          iVar13 = (cpi->common).mi_params.mi_rows;
          iVar15 = (cpi->common).mi_params.mi_cols;
          puVar9 = (cpi->active_map).map;
          uVar29 = iVar14 + iVar39;
          uVar31 = 0;
          if (0 < iVar41) {
            uVar31 = uVar43 & 0xffffffff;
          }
          local_d8 = 0;
          uVar43 = (ulong)uVar29;
          if ((int)uVar29 < 1) {
            uVar43 = 0;
          }
          local_40 = (ulong)(uint)(iVar15 << 4);
          uVar38 = 0;
          iVar39 = 0;
          for (uVar27 = 0; uVar27 != uVar43; uVar27 = uVar27 + 1) {
            iVar14 = iVar13 + (int)uVar27 * -0x10;
            if (0xf < iVar14) {
              iVar14 = 0x10;
            }
            uVar32 = local_d8;
            for (uVar33 = 0; uVar33 != uVar31; uVar33 = uVar33 + 1) {
              if (((cpi->active_map).enabled == 0) || ((cpi->rc).percent_blocks_inactive < 1)) {
LAB_001e9207:
                uVar29 = (*cpi->ppi->fn_ptr[0xc].sdf)(puVar45,iVar34,puVar40,iVar37);
                uVar21 = (ulong)uVar29;
              }
              else {
                iVar24 = iVar15 + (int)uVar33 * -0x10;
                if (0xf < iVar24) {
                  iVar24 = 0x10;
                }
                lVar44 = uVar32;
                for (iVar25 = 0; iVar25 < iVar14; iVar25 = iVar25 + 4) {
                  lVar36 = 0;
                  while (lVar36 < iVar24) {
                    iVar11 = (int)lVar36;
                    lVar36 = lVar36 + 4;
                    if (puVar9[(int)lVar44 + iVar11] == '\0') goto LAB_001e9207;
                  }
                  lVar44 = lVar44 + (ulong)(uint)(iVar15 * 4);
                }
                uVar21 = 0;
              }
              if (cpi->src_sad_blk_64x64 != (uint64_t *)0x0) {
                cpi->src_sad_blk_64x64[uVar33 + uVar27 * (long)iVar41] = uVar21;
              }
              iVar39 = iVar39 + (uint)(uVar21 == 0);
              if ((cpi->rc).max_block_source_sad < uVar21) {
                (cpi->rc).max_block_source_sad = uVar21;
              }
              uVar38 = uVar38 + uVar21;
              puVar45 = puVar45 + 0x40;
              puVar40 = puVar40 + 0x40;
              uVar32 = uVar32 + 0x10;
            }
            puVar45 = puVar45 + (iVar34 - iVar41) * 0x40;
            puVar40 = puVar40 + (iVar37 - iVar41) * 0x40;
            local_d8 = local_d8 + local_40;
          }
          local_f8 = (int)uVar31;
          uVar29 = (int)uVar43 * local_f8;
          if (0 < (int)uVar29) {
            uVar38 = uVar38 / uVar29;
          }
          uVar10 = (cpi->rc).avg_source_sad;
          uVar30 = (int)local_60 * (int)uVar10;
          if (uVar30 < local_e8) {
            uVar30 = local_e8;
          }
          if (((uVar30 < uVar38) &&
              ((cpi->svc).number_spatial_layers + 1 < (cpi->rc).frames_since_key)) &&
             (SBORROW4(iVar39,((int)uVar29 >> 2) * 3) != iVar39 + ((int)uVar29 >> 2) * -3 < 0)) {
            iVar13 = 1;
            bVar46 = false;
          }
          else {
            iVar13 = 0;
            bVar46 = true;
          }
          uVar43 = uVar10 * 3 + uVar38;
          (cpi->rc).high_source_sad = iVar13;
          (cpi->rc).avg_source_sad = uVar43 >> 2;
          (cpi->rc).frame_source_sad = uVar38;
          if (0 < (int)uVar29) {
            (cpi->rc).percent_blocks_with_motion = (int)((uVar29 - iVar39) * 100) / (int)uVar29;
          }
          if (uVar38 != 0) {
            (cpi->rc).static_since_last_scene_change = 0;
          }
          if (!bVar46) {
            (cpi->rc).frames_since_scene_change = 0;
            (cpi->rc).static_since_last_scene_change = 1;
          }
          if (((cpi->svc).temporal_layer_id == 0) && ((cpi->rc).drop_count_consec < 3)) {
            (cpi->rc).high_motion_content_screen_rtc = 0;
            if (((10 < (cpi->oxcf).speed) &&
                ((((((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN &&
                    (0x28 < (cpi->rc).percent_blocks_with_motion)) && (0x24003 < uVar43)) &&
                  ((0x9000 < (cpi->rc).prev_avg_source_sad &&
                   ((cpi->rc).avg_frame_low_motion < 0x3c)))) &&
                 (0x4ff < (pYVar6->field_0).field_0.y_width)))) &&
               ((0x2cf < (pYVar6->field_1).field_0.y_height &&
                ((cpi->rc).high_motion_content_screen_rtc = 1,
                ((cpi->common).seq_params)->bit_depth == AOM_BITS_8)))) {
              uVar29 = 0xc0;
              if (20000 < uVar38) {
                uVar29 = 0x200;
              }
              uVar43 = 0xa0;
              if (20000 < uVar38) {
                uVar43 = 0x200;
              }
              bVar46 = 0x1fa3ff <
                       (pYVar6->field_1).field_0.y_height * (pYVar6->field_0).field_0.y_width;
              uVar30 = (uint)uVar43;
              for (iVar13 = 0; bVar46 + 1 + (uint)bVar46 != iVar13; iVar13 = iVar13 + 1) {
                if (iVar13 == 2) {
                  iVar15 = 3;
LAB_001e94d7:
                  sVar23 = 2;
                }
                else {
                  if (iVar13 == 1) {
                    iVar15 = 1;
                    goto LAB_001e94d7;
                  }
                  sVar23 = 1;
                  iVar15 = 1;
                }
                iVar39 = (pYVar6->field_0).field_0.y_width;
                iVar14 = (pYVar6->field_1).field_0.y_height;
                uVar42 = (iVar39 * iVar15 >> sVar23) - 0x40;
                uVar16 = (iVar15 * iVar14 >> sVar23) - 0x40;
                if ((int)(~uVar30 + iVar39) < (int)uVar42) {
                  uVar42 = ~uVar30 + iVar39;
                }
                uVar31 = (ulong)uVar42;
                if ((int)uVar42 < (int)uVar30) {
                  uVar31 = uVar43;
                }
                if ((int)(~uVar29 + iVar14) < (int)uVar16) {
                  uVar16 = ~uVar29 + iVar14;
                }
                if ((int)uVar16 < (int)uVar29) {
                  uVar16 = uVar29;
                }
                iVar15 = (int)uVar31;
                if ((iVar15 < iVar39 + -0x40) && ((int)uVar16 < iVar14 + -0x40)) {
                  uVar42 = (cpi->oxcf).border_in_pixels & 0xfffffff0;
                  if ((SBORROW4(iVar15 - uVar30,-uVar42) != (int)((iVar15 - uVar30) + uVar42) < 0)
                     || (local_d8 = uVar43,
                        (int)((cpi->common).width + uVar42) < (int)(iVar15 + uVar30))) {
                    local_d8 = (ulong)uVar42;
                  }
                  if ((SBORROW4(uVar16 - uVar29,-uVar42) != (int)((uVar16 - uVar29) + uVar42) < 0)
                     || (uVar18 = uVar29,
                        (int)((cpi->common).height + uVar42) < (int)(uVar16 + uVar29))) {
                    uVar18 = uVar42;
                  }
                  puVar45 = (pYVar6->field_5).buffers[0];
                  puVar40 = (local_48->field_5).buffers[0];
                  iVar15 = (int)local_d8;
                  ref = (int16_t *)aom_malloc((long)(iVar15 * 2) * 2 + 0x100);
                  ref_00 = (int16_t *)aom_malloc((long)(int)(uVar18 * 2) * 2 + 0x100);
                  src = (int16_t *)aom_malloc(0x100);
                  src_00 = (int16_t *)aom_malloc(0x100);
                  auVar50._0_4_ = -(uint)((int)((ulong)ref >> 0x20) == 0 && (int)ref == 0);
                  auVar50._4_4_ = -(uint)((int)ref_00 == 0 && (int)((ulong)ref_00 >> 0x20) == 0);
                  auVar50._8_4_ = -(uint)((int)((ulong)src >> 0x20) == 0 && (int)src == 0);
                  auVar50._12_4_ = -(uint)((int)src_00 == 0 && (int)((ulong)src_00 >> 0x20) == 0);
                  iVar39 = movmskps((int)src_00,auVar50);
                  if (iVar39 != 0) {
                    aom_free(ref);
                    aom_free(ref_00);
                    aom_free(src);
                    aom_free(src_00);
                    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                       "Failed to allocate hbuf, vbuf, src_hbuf, or src_vbuf");
                  }
                  lVar44 = uVar31 + (long)(int)(uVar16 * iVar37);
                  (*aom_int_pro_row)(ref,puVar40 + (lVar44 - iVar15),iVar37,iVar15 * 2 + 0x80,0x80,6
                                    );
                  (*aom_int_pro_col)(ref_00,puVar40 + (lVar44 - (int)(uVar18 * iVar37)),iVar37,0x80,
                                     uVar18 * 2 + 0x80,7);
                  (*aom_int_pro_row)(src,puVar45 + uVar31 + (long)(int)(uVar16 * iVar34),iVar34,0x80
                                     ,0x80,6);
                  (*aom_int_pro_col)(src_00,puVar45 + uVar31 + (long)(int)(uVar16 * iVar34),iVar34,
                                     0x80,0x80,7);
                  uVar17 = av1_vector_match(ref,src,5,iVar15,1,&best_sad_col);
                  uVar16 = av1_vector_match(ref_00,src_00,5,uVar18,1,(int *)&local_68);
                  uVar42 = local_68;
                  if (best_sad_col < (int)local_68) {
                    uVar42 = best_sad_col;
                  }
                  uVar18 = 0;
                  if (best_sad_col < (int)local_68) {
                    uVar16 = uVar18;
                    uVar18 = uVar17;
                  }
                  aom_free(ref);
                  aom_free(ref_00);
                  aom_free(src);
                  aom_free(src_00);
                  uVar17 = -uVar18;
                  if (0 < (int)uVar18) {
                    uVar17 = uVar18;
                  }
                  uVar18 = 300;
                  if (uVar17 < 0x97) {
                    uVar26 = -uVar16;
                    if (0 < (int)uVar16) {
                      uVar26 = uVar16;
                    }
                    uVar18 = 0x96;
                    if (0x96 < uVar26) {
                      uVar18 = 300;
                    }
                  }
                  if (uVar42 < uVar18) {
                    uVar42 = -uVar16;
                    if (0 < (int)uVar16) {
                      uVar42 = uVar16;
                    }
                    if ((0x10 < uVar17) || (0x10 < uVar42)) {
                      (cpi->rc).high_motion_content_screen_rtc = 0;
                      break;
                    }
                  }
                }
              }
            }
            iVar13 = (cpi->svc).number_spatial_layers;
            if ((iVar13 < 2) && ((cpi->svc).number_temporal_layers < 2)) goto LAB_001e8aaa;
            iVar15 = 0;
            if (iVar13 < 1) {
              iVar13 = 0;
            }
            for (; iVar15 != iVar13; iVar15 = iVar15 + 1) {
              iVar34 = (cpi->svc).number_temporal_layers;
              lVar36 = (long)(iVar34 * iVar15) * 0x3380 + 0x33c4;
              for (lVar44 = 1; lVar44 < iVar34; lVar44 = lVar44 + 1) {
                *(int *)((long)&(((cpi->svc).layer_context)->rc).base_frame_target + lVar36) =
                     (cpi->rc).high_motion_content_screen_rtc;
                lVar36 = lVar36 + 0x3380;
              }
            }
          }
          lVar44 = (long)(cpi->svc).number_spatial_layers;
          if (1 < lVar44) {
            iVar13 = (cpi->svc).number_temporal_layers;
            piVar28 = &(cpi->svc).layer_context[(cpi->svc).temporal_layer_id].rc.high_source_sad;
            while (bVar46 = lVar44 != 0, lVar44 = lVar44 + -1, bVar46) {
              *piVar28 = (cpi->rc).high_source_sad;
              *(uint64_t *)(piVar28 + 6) = (cpi->rc).frame_source_sad;
              *(uint64_t *)(piVar28 + 2) = (cpi->rc).avg_source_sad;
              piVar28[0x28] = (cpi->rc).percent_blocks_with_motion;
              *(uint64_t *)(piVar28 + 0x2a) = (cpi->rc).max_block_source_sad;
              piVar28 = piVar28 + (long)iVar13 * 0xce0;
            }
          }
        }
      }
      else {
LAB_001e8a92:
        aom_free(cpi->src_sad_blk_64x64);
        cpi->src_sad_blk_64x64 = (uint64_t *)0x0;
      }
    }
  }
  else {
    (cpi->rc).frame_source_sad = 0;
    (cpi->rc).avg_source_sad = (cpi->rc).avg_source_sad * 3 >> 2;
    (cpi->rc).percent_blocks_with_motion = 0;
    (cpi->rc).high_source_sad = 0;
  }
LAB_001e8aaa:
  if ((((*frame_type == '\0') && ((cpi->sf).rt_sf.rc_adjust_keyframe != 0)) ||
      (((cpi->sf).rt_sf.rc_compute_spatial_var_sc != 0 && ((cpi->rc).high_source_sad != 0)))) &&
     ((((cpi->svc).spatial_layer_id == 0 &&
       (pSVar8 = (cpi->common).seq_params, pSVar8->bit_depth == AOM_BITS_8)) &&
      ((cpi->oxcf).rc_cfg.max_intra_bitrate_pct != 0)))) {
    puVar45 = (local_58->source->field_5).buffers[0];
    iVar13 = (local_58->source->field_4).field_0.y_stride;
    (cpi->rc).perc_spatial_flat_blocks = 0;
    iVar34 = pSVar8->mib_size >> (pSVar8->sb_size == BLOCK_128X128);
    iVar39 = ((cpi->common).mi_params.mi_cols + iVar34 + -1) / iVar34;
    iVar34 = (iVar34 + -1 + (cpi->common).mi_params.mi_rows) / iVar34;
    iVar15 = iVar13 - iVar39;
    iVar37 = 0;
    if (iVar39 < 1) {
      iVar39 = 0;
    }
    if (iVar34 < 1) {
      iVar34 = 0;
    }
    uVar43 = 0;
    for (iVar14 = 0; iVar41 = iVar39, iVar14 != iVar34; iVar14 = iVar14 + 1) {
      while (iVar41 != 0) {
        uVar29 = (*cpi->ppi->fn_ptr[0xc].vf)(puVar45,iVar13,AV1_VAR_OFFS,0,&local_34);
        uVar43 = uVar43 + uVar29;
        iVar37 = iVar37 + (uint)(uVar29 == 0);
        puVar45 = puVar45 + 0x40;
        iVar41 = iVar41 + -1;
      }
      puVar45 = puVar45 + iVar15 * 0x40;
    }
    uVar29 = iVar34 * iVar39;
    if (0 < (int)uVar29) {
      (cpi->rc).perc_spatial_flat_blocks = (iVar37 * 100) / (int)uVar29;
      uVar43 = uVar43 / uVar29;
    }
    (cpi->rc).frame_spatial_variance = uVar43 >> 0xc;
  }
  if ((cpi->oxcf).resize_cfg.resize_mode == '\x03') {
    if (((cpi->svc).number_spatial_layers == 1) && ((cpi->svc).temporal_layer_id == 0)) {
      if ((cpi->common).current_frame.frame_type == '\0') goto LAB_001e8dd3;
      dVar51 = cpi->framerate;
      if (dVar51 < (double)(cpi->rc).frames_since_key) {
        pAVar19 = cpi->ppi;
        iVar13 = 0x1e;
        if ((int)(dVar51 + dVar51) < 0x1e) {
          iVar13 = (int)(dVar51 + dVar51);
        }
        iVar15 = (cpi->common).width;
        iVar37 = (cpi->rc).resize_avg_qp + (pAVar19->p_rc).last_q[1];
        iVar34 = (cpi->common).height;
        (cpi->rc).resize_avg_qp = iVar37;
        if ((pAVar19->p_rc).buffer_level <
            (long)(int)(((pAVar19->p_rc).optimal_buffer_level * 0x1e) / 100)) {
          piVar28 = &(cpi->rc).resize_buffer_underflow;
          *piVar28 = *piVar28 + 1;
        }
        iVar39 = (cpi->rc).resize_count + 1;
        (cpi->rc).resize_count = iVar39;
        if (iVar13 <= iVar39) {
          iVar13 = 1;
          iVar37 = iVar37 / iVar39;
          RVar2 = (cpi->rc).resize_state;
          if ((iVar34 * iVar15 < 0x63d8) || ((cpi->rc).resize_buffer_underflow <= iVar39 >> 2)) {
            if ((RVar2 != ORIG) &&
               (iVar39 = (cpi->rc).worst_quality, iVar37 < (iVar39 * 0x46) / 100)) {
              if ((RVar2 == THREE_QUARTER) || (iVar37 < iVar39 / 2)) {
                (cpi->rc).resize_state = ORIG;
                (cpi->rc).resize_avg_qp = 0;
                (cpi->rc).resize_buffer_underflow = 0;
                (cpi->rc).resize_count = 0;
                iVar37 = iVar13;
                goto LAB_001e9894;
              }
              if (RVar2 == ONE_HALF) goto LAB_001e8db6;
            }
LAB_001e8dd3:
            (cpi->rc).resize_avg_qp = 0;
            (cpi->rc).resize_buffer_underflow = 0;
            (cpi->rc).resize_count = 0;
          }
          else {
            if (RVar2 == ORIG) {
LAB_001e8db6:
              iVar13 = 3;
              auVar49 = ZEXT812(1);
              (cpi->rc).resize_state = auVar49._0_4_;
              (cpi->rc).resize_avg_qp = auVar49._4_4_;
              (cpi->rc).resize_buffer_underflow = auVar49._8_4_;
              (cpi->rc).resize_count = 0;
              iVar37 = 4;
            }
            else {
              if (RVar2 != THREE_QUARTER) goto LAB_001e8dd3;
              auVar48 = ZEXT812(2);
              (cpi->rc).resize_state = auVar48._0_4_;
              (cpi->rc).resize_avg_qp = auVar48._4_4_;
              (cpi->rc).resize_buffer_underflow = auVar48._8_4_;
              (cpi->rc).resize_count = 0;
              iVar37 = 2;
            }
LAB_001e9894:
            resize_reset_rc(cpi,((cpi->oxcf).frm_dim_cfg.width * iVar13) / iVar37,
                            (iVar13 * (cpi->oxcf).frm_dim_cfg.height) / iVar37,iVar15,iVar34);
          }
        }
      }
    }
    RVar2 = (cpi->rc).resize_state;
    iVar13 = (cpi->oxcf).frm_dim_cfg.width;
    if (RVar2 == ONE_HALF) {
      (cpi->resize_pending_params).width = iVar13 + 1 >> 1;
      iVar13 = (cpi->oxcf).frm_dim_cfg.height + 1 >> 1;
    }
    else if (RVar2 == THREE_QUARTER) {
      (cpi->resize_pending_params).width = iVar13 * 3 + 3 >> 2;
      iVar13 = (cpi->oxcf).frm_dim_cfg.height * 3 + 3 >> 2;
    }
    else {
      (cpi->resize_pending_params).width = iVar13;
      iVar13 = (cpi->oxcf).frm_dim_cfg.height;
    }
    (cpi->resize_pending_params).height = iVar13;
  }
  else {
    iVar13 = is_frame_resize_pending(cpi);
    if (iVar13 != 0) {
      resize_reset_rc(cpi,(cpi->resize_pending_params).width,(cpi->resize_pending_params).height,
                      (cpi->common).width,(cpi->common).height);
    }
  }
  iVar13 = (cpi->svc).temporal_layer_id;
  if (iVar13 == 0) {
    (cpi->rc).num_col_blscroll_last_tl0 = 0;
    (cpi->rc).num_row_blscroll_last_tl0 = 0;
  }
  if ((cpi->rc).rtc_external_ratectrl == 0) {
    frame_type_00 = *frame_type;
    iVar15 = is_frame_resize_pending(cpi);
    if ((iVar15 == 0) && ((cpi->rc).high_source_sad == 0)) {
      if (iVar13 != 0 || (cpi->rc).frames_till_gf_update_due != 0) goto LAB_001e8ea9;
    }
    else if (iVar13 != 0) goto LAB_001e8ea9;
    if ((cpi->svc).spatial_layer_id == 0) {
      set_baseline_gf_interval(cpi,frame_type_00);
    }
  }
LAB_001e8ea9:
  aVar3 = (cpi->oxcf).rc_cfg.mode;
  if (aVar3 == AOM_CBR) {
    if ((*frame_type & 0xfd) == 0) {
      iVar13 = av1_calc_iframe_target_size_one_pass_cbr(cpi);
    }
    else {
      iVar13 = av1_calc_pframe_target_size_one_pass_cbr
                         (cpi,(pAVar4->gf_group).update_type[cpi->gf_frame_index]);
    }
  }
  else {
    if ((*frame_type & 0xfd) == 0) {
      iVar13 = av1_calc_iframe_target_size_one_pass_vbr(cpi);
    }
    else {
      iVar13 = av1_calc_pframe_target_size_one_pass_vbr
                         (cpi,(pAVar4->gf_group).update_type[cpi->gf_frame_index]);
    }
    if (aVar3 == AOM_Q) {
      (cpi->rc).active_worst_quality = (cpi->oxcf).rc_cfg.cq_level;
    }
  }
  av1_rc_set_frame_target(cpi,iVar13,(cpi->common).width,(cpi->common).height);
  (cpi->rc).base_frame_target = iVar13;
  (cpi->common).current_frame.frame_type = *frame_type;
  if ((((cpi->ppi->use_svc != 0) && ((cpi->svc).use_flexible_mode == 0)) &&
      ((cpi->svc).ksvc_fixed_mode != 0)) &&
     ((1 < (cpi->svc).number_spatial_layers &&
      ((cpi->svc).layer_context[local_50].is_key_frame == 0)))) {
    *(byte *)&(cpi->ext_flags).ref_frame_flags = (byte)(cpi->ext_flags).ref_frame_flags ^ 8;
  }
  return;
}

Assistant:

void av1_get_one_pass_rt_params(AV1_COMP *cpi, FRAME_TYPE *const frame_type,
                                const EncodeFrameInput *frame_input,
                                unsigned int frame_flags) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  AV1_COMMON *const cm = &cpi->common;
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  SVC *const svc = &cpi->svc;
  ResizePendingParams *const resize_pending_params =
      &cpi->resize_pending_params;
  int target;
  const int layer =
      LAYER_IDS_TO_IDX(svc->spatial_layer_id, svc->temporal_layer_id,
                       svc->number_temporal_layers);
  if (cpi->oxcf.rc_cfg.max_consec_drop_ms > 0) {
    double framerate =
        cpi->framerate > 1 ? round(cpi->framerate) : cpi->framerate;
    rc->max_consec_drop = saturate_cast_double_to_int(
        ceil(cpi->oxcf.rc_cfg.max_consec_drop_ms * framerate / 1000));
  }
  if (cpi->ppi->use_svc) {
    av1_update_temporal_layer_framerate(cpi);
    av1_restore_layer_context(cpi);
  }
  cpi->ppi->rtc_ref.bias_recovery_frame = set_flag_rps_bias_recovery_frame(cpi);
  // Set frame type.
  if (set_key_frame(cpi, frame_flags)) {
    *frame_type = KEY_FRAME;
    p_rc->this_key_frame_forced =
        cm->current_frame.frame_number != 0 && rc->frames_to_key == 0;
    rc->frames_to_key = cpi->oxcf.kf_cfg.key_freq_max;
    p_rc->kf_boost = DEFAULT_KF_BOOST_RT;
    gf_group->update_type[cpi->gf_frame_index] = KF_UPDATE;
    gf_group->frame_type[cpi->gf_frame_index] = KEY_FRAME;
    gf_group->refbuf_state[cpi->gf_frame_index] = REFBUF_RESET;
    if (cpi->ppi->use_svc) {
      if (cm->current_frame.frame_number > 0)
        av1_svc_reset_temporal_layers(cpi, 1);
      svc->layer_context[layer].is_key_frame = 1;
    }
    rc->frame_number_encoded = 0;
    cpi->ppi->rtc_ref.non_reference_frame = 0;
    rc->static_since_last_scene_change = 0;
  } else {
    *frame_type = INTER_FRAME;
    gf_group->update_type[cpi->gf_frame_index] = LF_UPDATE;
    gf_group->frame_type[cpi->gf_frame_index] = INTER_FRAME;
    gf_group->refbuf_state[cpi->gf_frame_index] = REFBUF_UPDATE;
    if (cpi->ppi->use_svc) {
      LAYER_CONTEXT *lc = &svc->layer_context[layer];
      lc->is_key_frame =
          svc->spatial_layer_id == 0
              ? 0
              : svc->layer_context[svc->temporal_layer_id].is_key_frame;
    }
    // If the user is setting the reference structure with
    // set_ref_frame_config and did not set any references, set the
    // frame type to Intra-only.
    if (cpi->ppi->rtc_ref.set_ref_frame_config) {
      int no_references_set = 1;
      for (int i = 0; i < INTER_REFS_PER_FRAME; i++) {
        if (cpi->ppi->rtc_ref.reference[i]) {
          no_references_set = 0;
          break;
        }
      }

      // Set to intra_only_frame if no references are set.
      // The stream can start decoding on INTRA_ONLY_FRAME so long as the
      // layer with the intra_only_frame doesn't signal a reference to a slot
      // that hasn't been set yet.
      if (no_references_set) *frame_type = INTRA_ONLY_FRAME;
    }
  }
  if (cpi->active_map.enabled && cpi->rc.percent_blocks_inactive == 100) {
    rc->frame_source_sad = 0;
    rc->avg_source_sad = (3 * rc->avg_source_sad + rc->frame_source_sad) >> 2;
    rc->percent_blocks_with_motion = 0;
    rc->high_source_sad = 0;
  } else if (cpi->sf.rt_sf.check_scene_detection &&
             svc->spatial_layer_id == 0) {
    if (rc->prev_coded_width == cm->width &&
        rc->prev_coded_height == cm->height) {
      rc_scene_detection_onepass_rt(cpi, frame_input);
    } else {
      aom_free(cpi->src_sad_blk_64x64);
      cpi->src_sad_blk_64x64 = NULL;
    }
  }
  if (((*frame_type == KEY_FRAME && cpi->sf.rt_sf.rc_adjust_keyframe) ||
       (cpi->sf.rt_sf.rc_compute_spatial_var_sc && rc->high_source_sad)) &&
      svc->spatial_layer_id == 0 && cm->seq_params->bit_depth == 8 &&
      cpi->oxcf.rc_cfg.max_intra_bitrate_pct > 0)
    rc_spatial_act_onepass_rt(cpi, frame_input->source->y_buffer,
                              frame_input->source->y_stride);
  // Check for dynamic resize, for single spatial layer for now.
  // For temporal layers only check on base temporal layer.
  if (cpi->oxcf.resize_cfg.resize_mode == RESIZE_DYNAMIC) {
    if (svc->number_spatial_layers == 1 && svc->temporal_layer_id == 0)
      dynamic_resize_one_pass_cbr(cpi);
    if (rc->resize_state == THREE_QUARTER) {
      resize_pending_params->width = (3 + cpi->oxcf.frm_dim_cfg.width * 3) >> 2;
      resize_pending_params->height =
          (3 + cpi->oxcf.frm_dim_cfg.height * 3) >> 2;
    } else if (rc->resize_state == ONE_HALF) {
      resize_pending_params->width = (1 + cpi->oxcf.frm_dim_cfg.width) >> 1;
      resize_pending_params->height = (1 + cpi->oxcf.frm_dim_cfg.height) >> 1;
    } else {
      resize_pending_params->width = cpi->oxcf.frm_dim_cfg.width;
      resize_pending_params->height = cpi->oxcf.frm_dim_cfg.height;
    }
  } else if (is_frame_resize_pending(cpi)) {
    resize_reset_rc(cpi, resize_pending_params->width,
                    resize_pending_params->height, cm->width, cm->height);
  }
  if (svc->temporal_layer_id == 0) {
    rc->num_col_blscroll_last_tl0 = 0;
    rc->num_row_blscroll_last_tl0 = 0;
  }
  // Set the GF interval and update flag.
  if (!rc->rtc_external_ratectrl)
    set_gf_interval_update_onepass_rt(cpi, *frame_type);
  // Set target size.
  if (cpi->oxcf.rc_cfg.mode == AOM_CBR) {
    if (*frame_type == KEY_FRAME || *frame_type == INTRA_ONLY_FRAME) {
      target = av1_calc_iframe_target_size_one_pass_cbr(cpi);
    } else {
      target = av1_calc_pframe_target_size_one_pass_cbr(
          cpi, gf_group->update_type[cpi->gf_frame_index]);
    }
  } else {
    if (*frame_type == KEY_FRAME || *frame_type == INTRA_ONLY_FRAME) {
      target = av1_calc_iframe_target_size_one_pass_vbr(cpi);
    } else {
      target = av1_calc_pframe_target_size_one_pass_vbr(
          cpi, gf_group->update_type[cpi->gf_frame_index]);
    }
  }
  if (cpi->oxcf.rc_cfg.mode == AOM_Q)
    rc->active_worst_quality = cpi->oxcf.rc_cfg.cq_level;

  av1_rc_set_frame_target(cpi, target, cm->width, cm->height);
  rc->base_frame_target = target;
  cm->current_frame.frame_type = *frame_type;
  // For fixed mode SVC: if KSVC is enabled remove inter layer
  // prediction on spatial enhancement layer frames for frames
  // whose base is not KEY frame.
  if (cpi->ppi->use_svc && !svc->use_flexible_mode && svc->ksvc_fixed_mode &&
      svc->number_spatial_layers > 1 &&
      !svc->layer_context[layer].is_key_frame) {
    ExternalFlags *const ext_flags = &cpi->ext_flags;
    ext_flags->ref_frame_flags ^= AOM_GOLD_FLAG;
  }
}